

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mempool.c
# Opt level: O3

void pool_destroy(pool_t pool_id)

{
  pool_info_t __ptr;
  uint uVar1;
  undefined6 in_register_0000003a;
  ulong uVar2;
  ulong uVar3;
  
  prf_array_count(pools);
  uVar3 = CONCAT62(in_register_0000003a,pool_id) & 0xffffffff;
  __ptr = pools[uVar3];
  uVar1 = prf_array_count(__ptr->blocks);
  if (0 < (int)uVar1) {
    uVar2 = 0;
    do {
      free(__ptr->blocks[uVar2]->data);
      free(__ptr->blocks[uVar2]);
      uVar2 = uVar2 + 1;
    } while (uVar1 != uVar2);
  }
  prf_array_free(__ptr->blocks);
  free(__ptr);
  pools[uVar3] = (pool_info_t)0x0;
  return;
}

Assistant:

void
pool_destroy(
    pool_t pool_id )
{
    pool_t num_pools;
    pool_info_t pool;
    int num_blocks, i;

    num_pools = prf_array_count( pools );
    assert( (pool_id > 0) && (pool_id < num_pools));
    assert( pools[ pool_id ] != NULL );

    pool = pools[ pool_id ];
    num_blocks = prf_array_count( pool->blocks );
    for ( i = 0; i < num_blocks; i++ ) {
        free( pool->blocks[ i ]->data );
        free( pool->blocks[ i ] );
    }
    prf_array_free( pool->blocks );
    free( pool );
    pools[ pool_id ] = NULL;
}